

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O3

void touch_file(char *name)

{
  char *path;
  size_t sVar1;
  uint file;
  int iVar2;
  int iVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  size_t sVar6;
  uv_buf_t *bufs;
  int extraout_EDX;
  __pthread_internal_list *unaff_RBX;
  long lVar7;
  code *handle;
  uv_fs_event_t *puVar8;
  uv_timer_t *loop;
  uv_fs_t *unaff_R14;
  uv_fs_t req;
  size_t sStackY_848;
  char acStackY_840 [1032];
  uv_loop_t *puStackY_438;
  uv_fs_event_t uStackY_3f8;
  uv_fs_event_t uStackY_370;
  undefined1 auStackY_2e8 [16];
  code *pcStackY_2d8;
  code *pcStackY_2d0;
  code *apcStackY_2c8 [3];
  code *pcStackY_2b0;
  undefined1 auStackY_2a0 [176];
  uv_fs_t *puStackY_1f0;
  uv_buf_t local_1d8;
  uv_fs_t local_1c8;
  
  iVar3 = 2;
  puStackY_1f0 = (uv_fs_t *)0x1573fc;
  file = uv_fs_open((uv_loop_t *)0x0,&local_1c8,name,2,0,(uv_fs_cb)0x0);
  if ((int)file < 0) {
    puStackY_1f0 = (uv_fs_t *)0x15748e;
    touch_file_cold_1();
LAB_0015748e:
    puStackY_1f0 = (uv_fs_t *)0x157493;
    touch_file_cold_2();
  }
  else {
    unaff_RBX = (__pthread_internal_list *)(ulong)file;
    unaff_R14 = &local_1c8;
    puStackY_1f0 = (uv_fs_t *)0x157413;
    uv_fs_req_cleanup(unaff_R14);
    puStackY_1f0 = (uv_fs_t *)0x157424;
    local_1d8 = uv_buf_init("foo",4);
    bufs = &local_1d8;
    puStackY_1f0 = (uv_fs_t *)0x157451;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,unaff_R14,file,bufs,1,-1,(uv_fs_cb)0x0);
    iVar3 = (int)bufs;
    if (iVar2 < 0) goto LAB_0015748e;
    unaff_R14 = &local_1c8;
    puStackY_1f0 = (uv_fs_t *)0x157462;
    uv_fs_req_cleanup(unaff_R14);
    iVar3 = 0;
    puStackY_1f0 = (uv_fs_t *)0x157470;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,unaff_R14,file,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      puStackY_1f0 = (uv_fs_t *)0x15747e;
      uv_fs_req_cleanup(&local_1c8);
      return;
    }
  }
  puStackY_1f0 = (uv_fs_t *)run_test_fs_event_no_callback_on_close;
  touch_file_cold_3();
  auStackY_2a0._152_8_ = 0x1574a1;
  auStackY_2a0._168_8_ = unaff_RBX;
  puStackY_1f0 = unaff_R14;
  puVar4 = uv_default_loop();
  auStackY_2a0._152_8_ = 0x1574b3;
  remove("watch_dir/file1");
  auStackY_2a0._152_8_ = 0x1574bf;
  remove("watch_dir/");
  auStackY_2a0._152_8_ = 0x1574cb;
  create_dir("watch_dir");
  auStackY_2a0._152_8_ = 0x1574d3;
  create_file("watch_dir/file1");
  auStackY_2a0._152_8_ = 0x1574e2;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  if (iVar2 == 0) {
    iVar3 = 0;
    auStackY_2a0._152_8_ = 0x157506;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1",0);
    if (iVar2 != 0) goto LAB_0015759d;
    auStackY_2a0._152_8_ = 0x157521;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    auStackY_2a0._152_8_ = 0x15752b;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (fs_event_cb_called != 0) goto LAB_001575a2;
    if (close_cb_called != 1) goto LAB_001575a7;
    auStackY_2a0._152_8_ = 0x157549;
    remove("watch_dir/file1");
    auStackY_2a0._152_8_ = 0x157555;
    remove("watch_dir/");
    auStackY_2a0._152_8_ = 0x15755a;
    puVar4 = uv_default_loop();
    auStackY_2a0._152_8_ = 0x15756e;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    auStackY_2a0._152_8_ = 0x157578;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_2a0._152_8_ = 0x15757d;
    puVar5 = uv_default_loop();
    auStackY_2a0._152_8_ = 0x157585;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      auStackY_2a0._152_8_ = 0x15758e;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStackY_2a0._152_8_ = 0x15759d;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_0015759d:
    auStackY_2a0._152_8_ = 0x1575a2;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_001575a2:
    auStackY_2a0._152_8_ = 0x1575a7;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_001575a7:
    auStackY_2a0._152_8_ = 0x1575ac;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  auStackY_2a0._152_8_ = run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStackY_2b0 = (code *)0x1575be;
  auStackY_2a0._152_8_ = puVar4;
  puVar5 = uv_default_loop();
  pcStackY_2b0 = (code *)0x1575ce;
  puVar4 = puVar5;
  iVar2 = uv_timer_init(puVar5,(uv_timer_t *)auStackY_2a0);
  if (iVar2 == 0) {
    puVar4 = (uv_loop_t *)auStackY_2a0;
    iVar3 = 0;
    pcStackY_2b0 = (code *)0x1575ea;
    iVar2 = uv_timer_start((uv_timer_t *)puVar4,timer_cb,1,0);
    if (iVar2 != 0) goto LAB_0015764a;
    pcStackY_2b0 = (code *)0x1575f8;
    puVar4 = puVar5;
    uv_run(puVar5,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_0015764f;
    pcStackY_2b0 = (code *)0x157606;
    puVar5 = uv_default_loop();
    pcStackY_2b0 = (code *)0x15761a;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStackY_2b0 = (code *)0x157624;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStackY_2b0 = (code *)0x157629;
    puVar4 = uv_default_loop();
    pcStackY_2b0 = (code *)0x157631;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      pcStackY_2b0 = (code *)0x15763a;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStackY_2b0 = (code *)0x15764a;
    run_test_fs_event_immediate_close_cold_1();
LAB_0015764a:
    pcStackY_2b0 = (code *)0x15764f;
    run_test_fs_event_immediate_close_cold_2();
LAB_0015764f:
    pcStackY_2b0 = (code *)0x157654;
    run_test_fs_event_immediate_close_cold_3();
  }
  pcStackY_2b0 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStackY_2b0 = (code *)0x1a20de;
  apcStackY_2c8[0] = (code *)0x157670;
  apcStackY_2c8[2] = (code *)puVar5;
  iVar2 = uv_fs_event_init(*(uv_loop_t **)&puVar4->active_handles,&fs_event);
  if (iVar2 == 0) {
    iVar3 = 0;
    apcStackY_2c8[0] = (code *)0x157690;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".",0);
    if (iVar2 == 0) {
      apcStackY_2c8[0] = (code *)0x1576aa;
      uv_close((uv_handle_t *)&fs_event,close_cb);
      uv_close((uv_handle_t *)puVar4,close_cb);
      return;
    }
  }
  else {
    apcStackY_2c8[0] = (code *)0x1576c1;
    timer_cb_cold_1();
  }
  apcStackY_2c8[0] = run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  pcStackY_2d0 = (code *)0x1576cc;
  apcStackY_2c8[0] = (code *)puVar4;
  puVar4 = uv_default_loop();
  pcStackY_2d0 = (code *)0x1576db;
  create_dir("watch_dir");
  pcStackY_2d0 = (code *)0x1576e7;
  create_file("watch_dir/file");
  pcStackY_2d0 = (code *)0x1576f6;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  if (iVar2 == 0) {
    iVar3 = 0;
    pcStackY_2d0 = (code *)0x15771a;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir",0);
    if (iVar2 != 0) goto LAB_001577ae;
    pcStackY_2d0 = (code *)0x15772e;
    touch_file("watch_dir/file");
    pcStackY_2d0 = (code *)0x157741;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    pcStackY_2d0 = (code *)0x15774b;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001577b3;
    pcStackY_2d0 = (code *)0x157760;
    remove("watch_dir/file");
    pcStackY_2d0 = (code *)0x15776c;
    remove("watch_dir/");
    pcStackY_2d0 = (code *)0x157771;
    puVar4 = uv_default_loop();
    pcStackY_2d0 = (code *)0x157785;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStackY_2d0 = (code *)0x15778f;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_2d0 = (code *)0x157794;
    puVar5 = uv_default_loop();
    pcStackY_2d0 = (code *)0x15779c;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      pcStackY_2d0 = (code *)0x1577a5;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStackY_2d0 = (code *)0x1577ae;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_001577ae:
    pcStackY_2d0 = (code *)0x1577b3;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_001577b3:
    pcStackY_2d0 = (code *)0x1577b8;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  pcStackY_2d0 = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_event_cold_4();
  pcStackY_2d8 = (code *)0x1577c3;
  pcStackY_2d0 = (code *)puVar4;
  puVar4 = uv_default_loop();
  pcStackY_2d8 = (code *)0x1577cd;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStackY_2d8 = (code *)0x1577d9;
  create_dir("watch_dir");
  pcStackY_2d8 = (code *)0x1577e8;
  loop = (uv_timer_t *)puVar4;
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  if (iVar2 == 0) {
    puVar8 = &fs_event;
    iVar3 = 0;
    pcStackY_2d8 = (code *)0x15780c;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir",0);
    loop = (uv_timer_t *)puVar8;
    if (iVar2 != 0) goto LAB_001578de;
    pcStackY_2d8 = (code *)0x157823;
    loop = (uv_timer_t *)puVar4;
    iVar2 = uv_timer_init(puVar4,&timer);
    if (iVar2 != 0) goto LAB_001578e3;
    loop = &timer;
    iVar3 = 0;
    pcStackY_2d8 = (code *)0x157845;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar2 != 0) goto LAB_001578e8;
    pcStackY_2d8 = (code *)0x157857;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_2d8 = (code *)0x15786a;
    uv_close((uv_handle_t *)&timer,close_cb);
    pcStackY_2d8 = (code *)0x157877;
    loop = (uv_timer_t *)puVar4;
    uv_run(puVar4,UV_RUN_ONCE);
    if (close_cb_called != 2) goto LAB_001578ed;
    if (fs_event_cb_called != 3) goto LAB_001578f2;
    pcStackY_2d8 = (code *)0x157890;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStackY_2d8 = (code *)0x15789c;
    remove("watch_dir/");
    pcStackY_2d8 = (code *)0x1578a1;
    puVar4 = uv_default_loop();
    pcStackY_2d8 = (code *)0x1578b5;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStackY_2d8 = (code *)0x1578bf;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_2d8 = (code *)0x1578c4;
    loop = (uv_timer_t *)uv_default_loop();
    pcStackY_2d8 = (code *)0x1578cc;
    iVar2 = uv_loop_close((uv_loop_t *)loop);
    if (iVar2 == 0) {
      pcStackY_2d8 = (code *)0x1578d5;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStackY_2d8 = (code *)0x1578de;
    run_test_fs_event_close_in_callback_cold_1();
LAB_001578de:
    pcStackY_2d8 = (code *)0x1578e3;
    run_test_fs_event_close_in_callback_cold_2();
LAB_001578e3:
    pcStackY_2d8 = (code *)0x1578e8;
    run_test_fs_event_close_in_callback_cold_3();
LAB_001578e8:
    pcStackY_2d8 = (code *)0x1578ed;
    run_test_fs_event_close_in_callback_cold_4();
LAB_001578ed:
    pcStackY_2d8 = (code *)0x1578f2;
    run_test_fs_event_close_in_callback_cold_5();
LAB_001578f2:
    pcStackY_2d8 = (code *)0x1578f7;
    run_test_fs_event_close_in_callback_cold_6();
  }
  pcStackY_2d8 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  if (iVar3 == 0) {
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close((uv_handle_t *)loop,close_cb);
        return;
      }
      return;
    }
  }
  else {
    auStackY_2e8._8_8_ = 0x15792d;
    fs_event_cb_close_cold_1();
  }
  auStackY_2e8._8_8_ = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  auStackY_2e8._8_8_ = "watch_dir/file1";
  auStackY_2e8._0_8_ = puVar4;
  puVar5 = uv_default_loop();
  create_dir("watch_dir");
  handle = (code *)&uStackY_370;
  puVar4 = puVar5;
  iVar2 = uv_fs_event_init(puVar5,(uv_fs_event_t *)handle);
  if (iVar2 == 0) {
    handle = fs_event_cb_dir;
    puVar4 = (uv_loop_t *)&uStackY_370;
    iVar3 = 0;
    iVar2 = uv_fs_event_start((uv_fs_event_t *)puVar4,fs_event_cb_dir,"watch_dir",0);
    if (iVar2 != 0) goto LAB_00157a52;
    handle = (code *)&uStackY_3f8;
    puVar4 = puVar5;
    iVar2 = uv_fs_event_init(puVar5,(uv_fs_event_t *)handle);
    if (iVar2 != 0) goto LAB_00157a57;
    handle = fs_event_cb_dir;
    puVar4 = (uv_loop_t *)&uStackY_3f8;
    iVar3 = 0;
    iVar2 = uv_fs_event_start((uv_fs_event_t *)puVar4,fs_event_cb_dir,"watch_dir",0);
    if (iVar2 != 0) goto LAB_00157a5c;
    uv_close((uv_handle_t *)&uStackY_3f8,close_cb);
    uv_close((uv_handle_t *)&uStackY_370,close_cb);
    handle = (code *)0x0;
    puVar4 = puVar5;
    uv_run(puVar5,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_00157a61;
    remove("watch_dir/");
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    handle = (code *)0x0;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00157a52:
    run_test_fs_event_start_and_close_cold_2();
LAB_00157a57:
    run_test_fs_event_start_and_close_cold_3();
LAB_00157a5c:
    run_test_fs_event_start_and_close_cold_4();
LAB_00157a61:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar4 == (uv_loop_t *)&fs_event) {
    if (iVar3 != 0) goto LAB_00157ac6;
    if (extraout_EDX != 2) goto LAB_00157acb;
    iVar3 = strcmp((char *)handle,"file1");
    if (iVar3 != 0) goto LAB_00157ad0;
    iVar3 = uv_fs_event_stop(&fs_event);
    if (iVar3 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00157ac6:
    fs_event_cb_dir_cold_2();
LAB_00157acb:
    fs_event_cb_dir_cold_3();
LAB_00157ad0:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStackY_438 = puVar5;
  puVar4 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar7 = 0;
  do {
    iVar3 = uv_fs_event_init(puVar4,&fs_event);
    if (iVar3 != 0) {
LAB_00157cd4:
      run_test_fs_event_getpath_cold_1();
      goto LAB_00157cd9;
    }
    sStackY_848 = 0x400;
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_840,&sStackY_848);
    if (iVar3 != -0x16) {
LAB_00157ccf:
      run_test_fs_event_getpath_cold_2();
      goto LAB_00157cd4;
    }
    path = *(char **)((long)&DAT_001f7c10 + lVar7);
    iVar3 = uv_fs_event_start(&fs_event,fail_cb,path,0);
    if (iVar3 != 0) {
LAB_00157cca:
      run_test_fs_event_getpath_cold_3();
      goto LAB_00157ccf;
    }
    sStackY_848 = 0;
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_840,&sStackY_848);
    sVar1 = sStackY_848;
    if (iVar3 != -0x69) {
LAB_00157cc5:
      run_test_fs_event_getpath_cold_4();
      goto LAB_00157cca;
    }
    if (0x3ff < sStackY_848) {
LAB_00157cc0:
      run_test_fs_event_getpath_cold_5();
      goto LAB_00157cc5;
    }
    sVar6 = strlen(path);
    if (sVar1 != sVar6 + 1) {
LAB_00157cbb:
      run_test_fs_event_getpath_cold_6();
      goto LAB_00157cc0;
    }
    iVar3 = uv_fs_event_getpath(&fs_event,acStackY_840,&sStackY_848);
    sVar1 = sStackY_848;
    if (iVar3 != 0) {
LAB_00157cb6:
      run_test_fs_event_getpath_cold_7();
      goto LAB_00157cbb;
    }
    sVar6 = strlen(path);
    if (sVar1 != sVar6) {
LAB_00157cb1:
      run_test_fs_event_getpath_cold_8();
      goto LAB_00157cb6;
    }
    iVar3 = strcmp(acStackY_840,path);
    if (iVar3 != 0) {
LAB_00157cac:
      run_test_fs_event_getpath_cold_9();
      goto LAB_00157cb1;
    }
    iVar3 = uv_fs_event_stop(&fs_event);
    if (iVar3 != 0) {
LAB_00157ca7:
      run_test_fs_event_getpath_cold_10();
      goto LAB_00157cac;
    }
    uv_close((uv_handle_t *)&fs_event,close_cb);
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_00157ca7;
    }
    close_cb_called = 0;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x28);
  remove("watch_dir/");
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar3 = uv_loop_close(puVar4);
  if (iVar3 == 0) {
    uv_library_shutdown();
    return;
  }
LAB_00157cd9:
  run_test_fs_event_getpath_cold_12();
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar3 = uv_loop_close(puVar4);
  if (iVar3 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar8 = (uv_fs_event_t *)uv_default_loop();
  iVar3 = uv_fs_event_init((uv_loop_t *)puVar8,&fs_event);
  if (iVar3 == 0) {
    puVar8 = &fs_event;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar3 == 0) goto LAB_00157de4;
    puVar8 = &fs_event;
    iVar3 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar3 != 0) goto LAB_00157de9;
    puVar8 = &fs_event;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar3 == 0) goto LAB_00157dee;
    puVar8 = &fs_event;
    iVar3 = uv_is_active((uv_handle_t *)&fs_event);
    if (iVar3 == 0) {
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar8 = (uv_fs_event_t *)uv_default_loop();
      iVar3 = uv_loop_close((uv_loop_t *)puVar8);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00157df8;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00157de4:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00157de9:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00157dee:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00157df8:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar3 = uv_is_closing((uv_handle_t *)puVar8);
  if (iVar3 != 0) {
    return;
  }
  uv_close((uv_handle_t *)puVar8,(uv_close_cb)0x0);
  return;
}

Assistant:

static void touch_file(const char* name, unsigned int size) {
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;
  int r;
  unsigned int i;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT | O_TRUNC,
                 S_IWUSR | S_IRUSR, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r >= 0);
  file = r;

  buf = uv_buf_init("a", 1);

  /* Inefficient but simple. */
  for (i = 0; i < size; i++) {
    r = uv_fs_write(NULL, &req, file, &buf, 1, i, NULL);
    uv_fs_req_cleanup(&req);
    ASSERT(r >= 0);
  }

  r = uv_fs_close(NULL, &req, file, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r == 0);
}